

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * doctest::assertString(Enum at)

{
  Enum at_local;
  char *local_8;
  
  if (at == DT_WARN) {
    local_8 = "WARN";
  }
  else if (at == DT_CHECK) {
    local_8 = "CHECK";
  }
  else if (at == DT_REQUIRE) {
    local_8 = "REQUIRE";
  }
  else if (at == DT_WARN_THROWS) {
    local_8 = "WARN_THROWS";
  }
  else if (at == DT_CHECK_THROWS) {
    local_8 = "CHECK_THROWS";
  }
  else if (at == DT_REQUIRE_THROWS) {
    local_8 = "REQUIRE_THROWS";
  }
  else if (at == DT_WARN_THROWS_AS) {
    local_8 = "WARN_THROWS_AS";
  }
  else if (at == DT_CHECK_THROWS_AS) {
    local_8 = "CHECK_THROWS_AS";
  }
  else if (at == DT_REQUIRE_THROWS_AS) {
    local_8 = "REQUIRE_THROWS_AS";
  }
  else if (at == DT_WARN_THROWS_WITH) {
    local_8 = "WARN_THROWS_WITH";
  }
  else if (at == DT_CHECK_THROWS_WITH) {
    local_8 = "CHECK_THROWS_WITH";
  }
  else if (at == DT_REQUIRE_THROWS_WITH) {
    local_8 = "REQUIRE_THROWS_WITH";
  }
  else if (at == DT_WARN_THROWS_WITH_AS) {
    local_8 = "WARN_THROWS_WITH_AS";
  }
  else if (at == DT_CHECK_THROWS_WITH_AS) {
    local_8 = "CHECK_THROWS_WITH_AS";
  }
  else if (at == DT_REQUIRE_THROWS_WITH_AS) {
    local_8 = "REQUIRE_THROWS_WITH_AS";
  }
  else if (at == DT_WARN_NOTHROW) {
    local_8 = "WARN_NOTHROW";
  }
  else if (at == DT_CHECK_NOTHROW) {
    local_8 = "CHECK_NOTHROW";
  }
  else if (at == DT_REQUIRE_NOTHROW) {
    local_8 = "REQUIRE_NOTHROW";
  }
  else if (at == DT_WARN_FALSE) {
    local_8 = "WARN_FALSE";
  }
  else if (at == DT_CHECK_FALSE) {
    local_8 = "CHECK_FALSE";
  }
  else if (at == DT_REQUIRE_FALSE) {
    local_8 = "REQUIRE_FALSE";
  }
  else if (at == DT_WARN_UNARY) {
    local_8 = "WARN_UNARY";
  }
  else if (at == DT_CHECK_UNARY) {
    local_8 = "CHECK_UNARY";
  }
  else if (at == DT_REQUIRE_UNARY) {
    local_8 = "REQUIRE_UNARY";
  }
  else if (at == DT_WARN_UNARY_FALSE) {
    local_8 = "WARN_UNARY_FALSE";
  }
  else if (at == DT_CHECK_UNARY_FALSE) {
    local_8 = "CHECK_UNARY_FALSE";
  }
  else if (at == DT_REQUIRE_UNARY_FALSE) {
    local_8 = "REQUIRE_UNARY_FALSE";
  }
  else if (at == DT_WARN_EQ) {
    local_8 = "WARN_EQ";
  }
  else if (at == DT_CHECK_EQ) {
    local_8 = "CHECK_EQ";
  }
  else if (at == DT_REQUIRE_EQ) {
    local_8 = "REQUIRE_EQ";
  }
  else if (at == DT_WARN_NE) {
    local_8 = "WARN_NE";
  }
  else if (at == DT_CHECK_NE) {
    local_8 = "CHECK_NE";
  }
  else if (at == DT_REQUIRE_NE) {
    local_8 = "REQUIRE_NE";
  }
  else if (at == DT_WARN_LT) {
    local_8 = "WARN_LT";
  }
  else if (at == DT_CHECK_LT) {
    local_8 = "CHECK_LT";
  }
  else if (at == DT_REQUIRE_LT) {
    local_8 = "REQUIRE_LT";
  }
  else if (at == DT_WARN_GT) {
    local_8 = "WARN_GT";
  }
  else if (at == DT_CHECK_GT) {
    local_8 = "CHECK_GT";
  }
  else if (at == DT_REQUIRE_GT) {
    local_8 = "REQUIRE_GT";
  }
  else if (at == DT_WARN_GE) {
    local_8 = "WARN_GE";
  }
  else if (at == DT_CHECK_GE) {
    local_8 = "CHECK_GE";
  }
  else if (at == DT_REQUIRE_GE) {
    local_8 = "REQUIRE_GE";
  }
  else if (at == DT_WARN_LE) {
    local_8 = "WARN_LE";
  }
  else if (at == DT_CHECK_LE) {
    local_8 = "CHECK_LE";
  }
  else if (at == DT_REQUIRE_LE) {
    local_8 = "REQUIRE_LE";
  }
  else {
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char* assertString(assertType::Enum at) {
    DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4062) // enum 'x' in switch of enum 'y' is not handled
    switch(at) {  //!OCLINT missing default in switch statements
        case assertType::DT_WARN                    : return "WARN";
        case assertType::DT_CHECK                   : return "CHECK";
        case assertType::DT_REQUIRE                 : return "REQUIRE";

        case assertType::DT_WARN_FALSE              : return "WARN_FALSE";
        case assertType::DT_CHECK_FALSE             : return "CHECK_FALSE";
        case assertType::DT_REQUIRE_FALSE           : return "REQUIRE_FALSE";

        case assertType::DT_WARN_THROWS             : return "WARN_THROWS";
        case assertType::DT_CHECK_THROWS            : return "CHECK_THROWS";
        case assertType::DT_REQUIRE_THROWS          : return "REQUIRE_THROWS";

        case assertType::DT_WARN_THROWS_AS          : return "WARN_THROWS_AS";
        case assertType::DT_CHECK_THROWS_AS         : return "CHECK_THROWS_AS";
        case assertType::DT_REQUIRE_THROWS_AS       : return "REQUIRE_THROWS_AS";

        case assertType::DT_WARN_THROWS_WITH        : return "WARN_THROWS_WITH";
        case assertType::DT_CHECK_THROWS_WITH       : return "CHECK_THROWS_WITH";
        case assertType::DT_REQUIRE_THROWS_WITH     : return "REQUIRE_THROWS_WITH";

        case assertType::DT_WARN_THROWS_WITH_AS     : return "WARN_THROWS_WITH_AS";
        case assertType::DT_CHECK_THROWS_WITH_AS    : return "CHECK_THROWS_WITH_AS";
        case assertType::DT_REQUIRE_THROWS_WITH_AS  : return "REQUIRE_THROWS_WITH_AS";

        case assertType::DT_WARN_NOTHROW            : return "WARN_NOTHROW";
        case assertType::DT_CHECK_NOTHROW           : return "CHECK_NOTHROW";
        case assertType::DT_REQUIRE_NOTHROW         : return "REQUIRE_NOTHROW";

        case assertType::DT_WARN_EQ                 : return "WARN_EQ";
        case assertType::DT_CHECK_EQ                : return "CHECK_EQ";
        case assertType::DT_REQUIRE_EQ              : return "REQUIRE_EQ";
        case assertType::DT_WARN_NE                 : return "WARN_NE";
        case assertType::DT_CHECK_NE                : return "CHECK_NE";
        case assertType::DT_REQUIRE_NE              : return "REQUIRE_NE";
        case assertType::DT_WARN_GT                 : return "WARN_GT";
        case assertType::DT_CHECK_GT                : return "CHECK_GT";
        case assertType::DT_REQUIRE_GT              : return "REQUIRE_GT";
        case assertType::DT_WARN_LT                 : return "WARN_LT";
        case assertType::DT_CHECK_LT                : return "CHECK_LT";
        case assertType::DT_REQUIRE_LT              : return "REQUIRE_LT";
        case assertType::DT_WARN_GE                 : return "WARN_GE";
        case assertType::DT_CHECK_GE                : return "CHECK_GE";
        case assertType::DT_REQUIRE_GE              : return "REQUIRE_GE";
        case assertType::DT_WARN_LE                 : return "WARN_LE";
        case assertType::DT_CHECK_LE                : return "CHECK_LE";
        case assertType::DT_REQUIRE_LE              : return "REQUIRE_LE";

        case assertType::DT_WARN_UNARY              : return "WARN_UNARY";
        case assertType::DT_CHECK_UNARY             : return "CHECK_UNARY";
        case assertType::DT_REQUIRE_UNARY           : return "REQUIRE_UNARY";
        case assertType::DT_WARN_UNARY_FALSE        : return "WARN_UNARY_FALSE";
        case assertType::DT_CHECK_UNARY_FALSE       : return "CHECK_UNARY_FALSE";
        case assertType::DT_REQUIRE_UNARY_FALSE     : return "REQUIRE_UNARY_FALSE";
    }
    DOCTEST_MSVC_SUPPRESS_WARNING_POP
    return "";
}